

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isNotInConcatenationExpr(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if (((((kind == EndOfFile) || (kind == Semicolon)) || (kind == MinusArrow)) ||
      (((ushort)(kind - DisableKeyword) < 2 || (kind == ForeachKeyword)))) ||
     ((kind == IfKeyword || ((kind == SoftKeyword || (kind == UniqueKeyword)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isNotInConcatenationExpr(TokenKind kind) {
    switch (kind) {
        case TokenKind::Semicolon:
        case TokenKind::EndOfFile:
        case TokenKind::IfKeyword:
        case TokenKind::ForeachKeyword:
        case TokenKind::SoftKeyword:
        case TokenKind::UniqueKeyword:
        case TokenKind::DistKeyword:
        case TokenKind::DisableKeyword:
        case TokenKind::MinusArrow:
            return true;
        default:
            return false;
    }
}